

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemSMC.cpp
# Opt level: O2

void __thiscall chrono::ChSystemSMC::ArchiveIN(ChSystemSMC *this,ChArchiveIn *marchive)

{
  TangentialDisplacementModel_mapper mtangential_mapper;
  AdhesionForceModel_mapper madhesion_mapper;
  ContactForceModel_mapper mmodel_mapper;
  ChEnumMapper<chrono::ChSystemSMC::AdhesionForceModel> CStack_138;
  ChEnumMapper<chrono::ChSystemSMC::AdhesionForceModel> local_118;
  ChEnumMapper<chrono::ChSystemSMC::TangentialDisplacementModel> local_f8;
  ChEnumMapper<chrono::ChSystemSMC::ContactForceModel> local_d8;
  ChNameValue<chrono::ChEnumMapper<chrono::ChSystemSMC::TangentialDisplacementModel>_> local_b8;
  ChNameValue<chrono::ChEnumMapper<chrono::ChSystemSMC::AdhesionForceModel>_> local_a0;
  ChNameValue<chrono::ChEnumMapper<chrono::ChSystemSMC::ContactForceModel>_> local_88;
  ChNameValue<double> local_70;
  ChNameValue<double> local_58;
  ChNameValue<bool> local_40;
  
  ChArchiveIn::VersionRead<chrono::ChSystemSMC>(marchive);
  ChSystem::ArchiveIN(&this->super_ChSystem,marchive);
  local_40._value = (bool *)&(this->super_ChSystem).field_0x379;
  local_40._name = "m_use_mat_props";
  local_40._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_40);
  local_58._value = &this->m_minSlipVelocity;
  local_58._name = "m_minSlipVelocity";
  local_58._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_58);
  local_70._value = &this->m_characteristicVelocity;
  local_70._name = "m_characteristicVelocity";
  local_70._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_70);
  my_enum_mappers::ContactForceModel_mapper::ContactForceModel_mapper
            ((ContactForceModel_mapper *)&local_d8);
  my_enum_mappers::ContactForceModel_mapper::operator()
            ((ChEnumMapper<chrono::ChSystemSMC::ContactForceModel> *)&local_118,
             (ContactForceModel_mapper *)&local_d8,
             (ContactForceModel *)&(this->super_ChSystem).field_0x37c);
  local_88._name = "contact_model";
  local_88._flags = '\0';
  local_88._value = (ChEnumMapper<chrono::ChSystemSMC::ContactForceModel> *)&local_118;
  ChArchiveIn::operator>>(marchive,&local_88);
  ChEnumMapper<chrono::ChSystemSMC::ContactForceModel>::~ChEnumMapper
            ((ChEnumMapper<chrono::ChSystemSMC::ContactForceModel> *)&local_118);
  my_enum_mappers::AdhesionForceModel_mapper::AdhesionForceModel_mapper
            ((AdhesionForceModel_mapper *)&local_118);
  my_enum_mappers::AdhesionForceModel_mapper::operator()
            (&CStack_138,(AdhesionForceModel_mapper *)&local_118,&this->m_adhesion_model);
  local_a0._name = "adhesion_model";
  local_a0._flags = '\0';
  local_a0._value = &CStack_138;
  ChArchiveIn::operator>>(marchive,&local_a0);
  ChEnumMapper<chrono::ChSystemSMC::AdhesionForceModel>::~ChEnumMapper(&CStack_138);
  my_enum_mappers::TangentialDisplacementModel_mapper::TangentialDisplacementModel_mapper
            ((TangentialDisplacementModel_mapper *)&CStack_138);
  my_enum_mappers::TangentialDisplacementModel_mapper::operator()
            (&local_f8,(TangentialDisplacementModel_mapper *)&CStack_138,&this->m_tdispl_model);
  local_b8._name = "tangential_model";
  local_b8._flags = '\0';
  local_b8._value = &local_f8;
  ChArchiveIn::operator>>(marchive,&local_b8);
  ChEnumMapper<chrono::ChSystemSMC::TangentialDisplacementModel>::~ChEnumMapper(&local_f8);
  (*(this->super_ChSystem).super_ChIntegrableIIorder.super_ChIntegrable._vptr_ChIntegrable[0x3d])
            (this);
  ChEnumMapper<chrono::ChSystemSMC::TangentialDisplacementModel>::~ChEnumMapper
            ((ChEnumMapper<chrono::ChSystemSMC::TangentialDisplacementModel> *)&CStack_138);
  ChEnumMapper<chrono::ChSystemSMC::AdhesionForceModel>::~ChEnumMapper(&local_118);
  ChEnumMapper<chrono::ChSystemSMC::ContactForceModel>::~ChEnumMapper(&local_d8);
  return;
}

Assistant:

void ChSystemSMC::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/marchive.VersionRead<ChSystemSMC>();

    // deserialize parent class
    ChSystem::ArchiveIN(marchive);

    // stream in all member data:
    marchive >> CHNVP(m_use_mat_props);
    marchive >> CHNVP(m_minSlipVelocity);
    marchive >> CHNVP(m_characteristicVelocity);
    my_enum_mappers::ContactForceModel_mapper mmodel_mapper;
    marchive >> CHNVP(mmodel_mapper(m_contact_model), "contact_model");
    my_enum_mappers::AdhesionForceModel_mapper madhesion_mapper;
    marchive >> CHNVP(madhesion_mapper(m_adhesion_model), "adhesion_model");
    my_enum_mappers::TangentialDisplacementModel_mapper mtangential_mapper;
    marchive >> CHNVP(mtangential_mapper(m_tdispl_model), "tangential_model");
    //***TODO*** complete...

    // Recompute statistics, offsets, etc.
    this->Setup();
}